

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O3

psa_status_t psa_generate_key(psa_key_attributes_t *attributes,psa_key_handle_t *handle)

{
  ushort uVar1;
  psa_key_type_t type;
  ulong uVar2;
  psa_key_slot_t *ppVar3;
  psa_status_t pVar4;
  mbedtls_ecp_group_id grp_id;
  int ret;
  mbedtls_ecp_curve_info *pmVar5;
  mbedtls_ecp_keypair *key;
  ulong uVar6;
  code *driver_00;
  psa_se_drv_table_entry_t **in_R8;
  uint uVar7;
  uint exponent;
  psa_key_slot_t *slot;
  psa_se_drv_table_entry_t *driver;
  psa_key_slot_t *local_40;
  psa_key_slot_t *local_38;
  
  local_40 = (psa_key_slot_t *)0x0;
  local_38 = (psa_key_slot_t *)0x0;
  if ((attributes->core).bits == 0) {
    return -0x87;
  }
  pVar4 = psa_start_key_creation
                    ((psa_key_creation_method_t)attributes,(psa_key_attributes_t *)handle,
                     (psa_key_handle_t *)&local_40,&local_38,in_R8);
  ppVar3 = local_40;
  if (pVar4 != 0) goto LAB_00115c8f;
  uVar2 = attributes->domain_parameters_size;
  pVar4 = -0x87;
  if (attributes->domain_parameters == (void *)0x0 && uVar2 != 0) goto LAB_00115c8f;
  uVar1 = (attributes->core).bits;
  type = (local_40->attr).type;
  if (((type & 0x7000) == 0x2000) || ((type & 0x7000) == 0x1000)) {
    pVar4 = prepare_raw_data_slot(type,(ulong)uVar1,&(local_40->data).raw);
    if (pVar4 != 0) goto LAB_00115c8f;
    driver_00 = (code *)(ppVar3->data).raw.bytes;
    pVar4 = psa_generate_random((ppVar3->data).raw.data,(size_t)driver_00);
    if (pVar4 != 0) goto LAB_00115c8f;
    if (type == 0x2301) {
      driver_00 = (code *)(ppVar3->data).raw.bytes;
      psa_des_set_key_parity((ppVar3->data).raw.data,(size_t)driver_00);
    }
LAB_00115ec7:
    pVar4 = psa_finish_key_creation(local_40,(psa_se_drv_table_entry_t *)driver_00);
    if (pVar4 == 0) {
      return 0;
    }
  }
  else {
    if (type == 0x7001) {
      pVar4 = -0x86;
      if ((uVar1 & 7) != 0 || 0x1000 < uVar1) goto LAB_00115c8f;
      if (uVar2 == 0) {
        exponent = 0x10001;
      }
      else {
        if (4 < uVar2) goto LAB_00115c8f;
        uVar6 = 0;
        exponent = 0;
        do {
          uVar7 = exponent;
          exponent = (uint)*(byte *)((long)attributes->domain_parameters + uVar6) | uVar7 << 8;
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
        if ((int)(uVar7 << 8) < 0) goto LAB_00115c8f;
      }
      key = (mbedtls_ecp_keypair *)calloc(1,0x150);
      if (key != (mbedtls_ecp_keypair *)0x0) {
        mbedtls_rsa_init((mbedtls_rsa_context *)key,0,0);
        driver_00 = mbedtls_ctr_drbg_random;
        ret = mbedtls_rsa_gen_key((mbedtls_rsa_context *)key,mbedtls_ctr_drbg_random,
                                  &global_data.ctr_drbg,(uint)uVar1,exponent);
        if (ret == 0) {
LAB_00115ebf:
          (ppVar3->data).rsa = (mbedtls_rsa_context *)key;
        }
        else {
          mbedtls_rsa_free((mbedtls_rsa_context *)key);
LAB_00115e9c:
          free(key);
          pVar4 = mbedtls_to_psa_error(ret);
          if (pVar4 != 0) goto LAB_00115c8f;
        }
        goto LAB_00115ec7;
      }
    }
    else {
      pVar4 = -0x86;
      if ((type & 0xff00) != 0x7100) goto LAB_00115c8f;
      grp_id = mbedtls_ecc_group_of_psa((psa_ecc_curve_t)type,(ulong)(uVar1 + 7 >> 3));
      pmVar5 = mbedtls_ecp_curve_info_from_grp_id(grp_id);
      if (((uVar2 != 0) ||
          (pmVar5 == (mbedtls_ecp_curve_info *)0x0 || grp_id == MBEDTLS_ECP_DP_NONE)) ||
         (pVar4 = -0x87, pmVar5->bit_size != uVar1)) goto LAB_00115c8f;
      key = (mbedtls_ecp_keypair *)calloc(1,0x158);
      if (key != (mbedtls_ecp_keypair *)0x0) {
        mbedtls_ecp_keypair_init(key);
        driver_00 = (code *)key;
        ret = mbedtls_ecp_gen_key(grp_id,key,mbedtls_ctr_drbg_random,&global_data.ctr_drbg);
        if (ret == 0) goto LAB_00115ebf;
        mbedtls_ecp_keypair_free(key);
        goto LAB_00115e9c;
      }
    }
    pVar4 = -0x8d;
  }
LAB_00115c8f:
  if (local_40 != (psa_key_slot_t *)0x0) {
    psa_wipe_key_slot(local_40);
  }
  *handle = 0;
  return pVar4;
}

Assistant:

psa_status_t psa_generate_key( const psa_key_attributes_t *attributes,
                               psa_key_handle_t *handle )
{
    psa_status_t status;
    psa_key_slot_t *slot = NULL;
    psa_se_drv_table_entry_t *driver = NULL;

    /* Reject any attempt to create a zero-length key so that we don't
     * risk tripping up later, e.g. on a malloc(0) that returns NULL. */
    if( psa_get_key_bits( attributes ) == 0 )
        return( PSA_ERROR_INVALID_ARGUMENT );

    status = psa_start_key_creation( PSA_KEY_CREATION_GENERATE,
                                     attributes, handle, &slot, &driver );
    if( status != PSA_SUCCESS )
        goto exit;

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    if( driver != NULL )
    {
        const psa_drv_se_t *drv = psa_get_se_driver_methods( driver );
        size_t pubkey_length = 0; /* We don't support this feature yet */
        if( drv->key_management == NULL ||
            drv->key_management->p_generate == NULL )
        {
            status = PSA_ERROR_NOT_SUPPORTED;
            goto exit;
        }
        status = drv->key_management->p_generate(
            psa_get_se_driver_context( driver ),
            slot->data.se.slot_number, attributes,
            NULL, 0, &pubkey_length );
    }
    else
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */
    {
        status = psa_generate_key_internal(
            slot, attributes->core.bits,
            attributes->domain_parameters, attributes->domain_parameters_size );
    }

exit:
    if( status == PSA_SUCCESS )
        status = psa_finish_key_creation( slot, driver );
    if( status != PSA_SUCCESS )
    {
        psa_fail_key_creation( slot, driver );
        *handle = 0;
    }
    return( status );
}